

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O0

size_t ZSTD_fseBitCost(FSE_CTable *ctable,uint *count,uint max)

{
  uint uVar1;
  int iVar2;
  U32 UVar3;
  uint bitCost;
  uint badCost;
  uint tableLog;
  FSE_CState_t cstate;
  ulong uStack_30;
  uint s;
  size_t cost;
  uint kAccuracyLog;
  uint max_local;
  uint *count_local;
  FSE_CTable *ctable_local;
  
  uStack_30 = 0;
  FSE_initCState((FSE_CState_t *)&badCost,ctable);
  uVar1 = ZSTD_getFSEMaxSymbolValue(ctable);
  if (uVar1 < max) {
    ctable_local = (FSE_CTable *)0xffffffffffffffff;
  }
  else {
    for (cstate._28_4_ = 0; (uint)cstate._28_4_ <= max; cstate._28_4_ = cstate._28_4_ + 1) {
      iVar2 = (U32)cstate.symbolTT + 1;
      UVar3 = FSE_bitCost(cstate.stateTable,(U32)cstate.symbolTT,cstate._28_4_,8);
      if (count[(uint)cstate._28_4_] != 0) {
        if ((uint)(iVar2 * 0x100) <= UVar3) {
          return 0xffffffffffffffff;
        }
        uStack_30 = (ulong)count[(uint)cstate._28_4_] * (ulong)UVar3 + uStack_30;
      }
    }
    ctable_local = (FSE_CTable *)(uStack_30 >> 8);
  }
  return (size_t)ctable_local;
}

Assistant:

size_t ZSTD_fseBitCost(
    FSE_CTable const* ctable,
    unsigned const* count,
    unsigned const max)
{
    unsigned const kAccuracyLog = 8;
    size_t cost = 0;
    unsigned s;
    FSE_CState_t cstate;
    FSE_initCState(&cstate, ctable);
    if (ZSTD_getFSEMaxSymbolValue(ctable) < max) {
        DEBUGLOG(5, "Repeat FSE_CTable has maxSymbolValue %u < %u",
                    ZSTD_getFSEMaxSymbolValue(ctable), max);
        return ERROR(GENERIC);
    }
    for (s = 0; s <= max; ++s) {
        unsigned const tableLog = cstate.stateLog;
        unsigned const badCost = (tableLog + 1) << kAccuracyLog;
        unsigned const bitCost = FSE_bitCost(cstate.symbolTT, tableLog, s, kAccuracyLog);
        if (count[s] == 0)
            continue;
        if (bitCost >= badCost) {
            DEBUGLOG(5, "Repeat FSE_CTable has Prob[%u] == 0", s);
            return ERROR(GENERIC);
        }
        cost += (size_t)count[s] * bitCost;
    }
    return cost >> kAccuracyLog;
}